

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O1

bool Diligent::VerifySamplerBinding<Diligent::SamplerVkImpl>
               (PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,SamplerVkImpl *pSamplerImpl
               ,IDeviceObject *pCachedSampler,char *SignatureName)

{
  bool bVar1;
  string msg;
  string local_50;
  
  if (BindInfo->BufferRangeSize != 0 || BindInfo->BufferBaseOffset != 0) {
    FormatString<char[46]>
              (&local_50,(char (*) [46])"Buffer range can\'t be specified for samplers.");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"VerifySamplerBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x1ff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pSamplerImpl != (SamplerVkImpl *)0x0) &&
     (((pSamplerImpl->super_SamplerBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::ISamplerVk,_Diligent::RenderDeviceVkImpl,_Diligent::SamplerDesc>
       .m_Desc.Flags & SAMPLER_FLAG_SUBSAMPLED) != SAMPLER_FLAG_NONE)) {
    FormatString<char[90]>
              (&local_50,
               (char (*) [90])
               "Subsampled sampler must be added as an immutable sampler to the PSO or resource signature"
              );
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"VerifySamplerBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x203);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = VerifyResourceBinding<Diligent::SamplerVkImpl>
                    ("sampler",ResDesc,BindInfo,pSamplerImpl,pCachedSampler,SignatureName);
  return bVar1;
}

Assistant:

bool VerifySamplerBinding(const PipelineResourceDesc& ResDesc,
                          const BindResourceInfo&     BindInfo,
                          const SamplerImplType*      pSamplerImpl,
                          const IDeviceObject*        pCachedSampler,
                          const char*                 SignatureName)
{
    if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Buffer range can't be specified for samplers.");
    }
    if (pSamplerImpl != nullptr && (pSamplerImpl->GetDesc().Flags & SAMPLER_FLAG_SUBSAMPLED) != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Subsampled sampler must be added as an immutable sampler to the PSO or resource signature");
    }
    return VerifyResourceBinding("sampler", ResDesc, BindInfo, pSamplerImpl, pCachedSampler, SignatureName);
}